

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

double __thiscall
PlanningUnitMADPDiscrete::GetJAOHProbs
          (PlanningUnitMADPDiscrete *this,JointBeliefInterface *jb,LIndex jaohI,LIndex p_jaohI,
          JointBeliefInterface *p_jb,JointPolicyDiscrete *jpol)

{
  value_type pJVar1;
  code *pcVar2;
  long lVar3;
  PlanningUnitMADPDiscrete *pPVar4;
  JointPolicyDiscrete *pJVar5;
  JointBeliefInterface *i;
  LIndex LVar6;
  bool bVar7;
  Index IVar8;
  undefined8 uVar9;
  ostream *this_00;
  const_reference ppJVar10;
  const_reference pvVar11;
  MultiAgentDecisionProcessDiscreteInterface *pMVar12;
  PlanningUnitMADPDiscreteParameters *this_01;
  long lVar13;
  double dVar14;
  undefined8 auStackY_150 [3];
  undefined1 auStackY_138 [8];
  long local_130;
  long local_128;
  LIndex local_120;
  long local_118;
  long local_110;
  LIndex local_108;
  LIndex in_stack_ffffffffffffff00;
  vector<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_> *this_02;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffff08;
  vector<double,_std::allocator<double>_> *pvVar15;
  undefined1 *local_e0;
  long local_d8;
  long local_d0;
  Index IStack_cc;
  LIndex local_c8;
  vector<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_> *local_c0;
  undefined8 local_b8;
  PlanningUnitMADPDiscrete *local_b0 [2];
  double p;
  double pr_cond;
  double p_pr;
  double pr;
  Index tI;
  ulong auStack_78 [2];
  unsigned_long __vla_expr3;
  unsigned_long __vla_expr2;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  Index local_48;
  uint local_44;
  Index t_p;
  Index t;
  JointPolicyDiscrete *jpol_local;
  JointBeliefInterface *p_jb_local;
  LIndex p_jaohI_local;
  LIndex jaohI_local;
  JointBeliefInterface *jb_local;
  PlanningUnitMADPDiscrete *this_local;
  
  local_b0[0] = this;
  _t_p = jpol;
  jpol_local = (JointPolicyDiscrete *)p_jb;
  p_jb_local = (JointBeliefInterface *)p_jaohI;
  p_jaohI_local = jaohI;
  jaohI_local = (LIndex)jb;
  jb_local = (JointBeliefInterface *)this;
  if (((p_jaohI == 0) && (p_jb == (JointBeliefInterface *)0x0)) &&
     (jpol == (JointPolicyDiscrete *)0x0)) {
    auStackY_150[2] = 0x9da15f;
    bVar7 = PlanningUnitMADPDiscreteParameters::GetComputeJointBeliefs(&this->_m_params);
    if (bVar7) {
      local_c0 = &local_b0[0]->_m_jBeliefCache;
      auStackY_150[2] = 0x9da182;
      IVar8 = Globals::CastLIndexToIndex(p_jaohI_local);
      auStackY_150[2] = 0x9da192;
      ppJVar10 = std::
                 vector<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>
                 ::operator[](local_c0,(ulong)IVar8);
      auStackY_150[2] = 0x9da1a2;
      (**(code **)(*(long *)jaohI_local + 0xa8))(jaohI_local,*ppJVar10);
      local_b8 = &local_b0[0]->_m_jaohProbs;
      auStackY_150[2] = 0x9da1bf;
      IVar8 = Globals::CastLIndexToIndex(p_jaohI_local);
      auStackY_150[2] = 0x9da1cf;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](local_b8,(ulong)IVar8);
      return *pvVar11;
    }
  }
  auStackY_150[2] = 0x9da1ef;
  local_44 = GetTimeStepForJAOHI(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  auStackY_150[2] = 0x9da202;
  local_48 = GetTimeStepForJAOHI(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  __vla_expr0 = (unsigned_long)auStackY_138;
  local_e0 = auStackY_138 + -((ulong)local_44 * 4 + 0xf & 0xfffffffffffffff0);
  __vla_expr1 = (ulong)local_44;
  lVar13 = (long)(auStackY_138 + -((ulong)local_44 * 4 + 0xf & 0xfffffffffffffff0)) -
           ((ulong)local_44 * 4 + 0xf & 0xfffffffffffffff0);
  local_d8 = lVar13;
  __vla_expr2 = (ulong)local_44;
  *(undefined8 *)(lVar13 + -8) = 0x9da265;
  GetJointActionObservationHistoryArrays
            (*(PlanningUnitMADPDiscrete **)(lVar13 + 0x78),*(LIndex *)(lVar13 + 0x70),
             *(Index *)(lVar13 + 0x6c),*(Index **)(lVar13 + 0x60),*(Index **)(lVar13 + 0x58));
  local_d0 = lVar13 - ((ulong)local_48 * 4 + 0xf & 0xfffffffffffffff0);
  __vla_expr3 = (ulong)local_48;
  lVar13 = local_d0 - ((ulong)local_48 * 4 + 0xf & 0xfffffffffffffff0);
  local_c8 = lVar13;
  auStack_78[1] = (ulong)local_48;
  if (p_jb_local != (JointBeliefInterface *)0x0) {
    if (local_44 <= local_48) {
      return 0.0;
    }
    if (local_48 == 0) {
      *(undefined8 *)(lVar13 + -8) = 0x9da2e3;
      uVar9 = __cxa_allocate_exception(0x28);
      *(undefined8 *)(lVar13 + -8) = 0x9da2fc;
      E::E(*(E **)(lVar13 + 0x38),*(char **)(lVar13 + 0x30));
      *(undefined1 **)(lVar13 + -8) = &LAB_009da318;
      __cxa_throw(uVar9,&E::typeinfo,E::~E);
    }
    *(undefined8 *)(lVar13 + -8) = 0x9da356;
    GetJointActionObservationHistoryArrays
              (*(PlanningUnitMADPDiscrete **)(lVar13 + 0x78),*(LIndex *)(lVar13 + 0x70),
               *(Index *)(lVar13 + 0x6c),*(Index **)(lVar13 + 0x60),*(Index **)(lVar13 + 0x58));
    for (pr._0_4_ = 0; pr._0_4_ < local_48; pr._0_4_ = pr._0_4_ + 1) {
      if ((*(int *)(local_e0 + (ulong)pr._0_4_ * 4) != *(int *)(local_d0 + (ulong)pr._0_4_ * 4)) ||
         (*(int *)(local_d8 + (ulong)pr._0_4_ * 4) != *(int *)(local_c8 + (ulong)pr._0_4_ * 4))) {
        *(undefined8 *)(lVar13 + -8) = 0x9da3b6;
        this_00 = std::operator<<((ostream *)&std::cerr,
                                  "GetJAOHProbs:: Warning pred. inconsistent with requested jaohI");
        *(undefined8 *)(lVar13 + -8) = 0x9da3c5;
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        return 0.0;
      }
    }
  }
  LVar6 = jaohI_local;
  pJVar5 = jpol_local;
  pPVar4 = local_b0[0];
  if ((p_jb_local == (JointBeliefInterface *)0x0) || (jpol_local != (JointPolicyDiscrete *)0x0)) {
    if (jpol_local == (JointPolicyDiscrete *)0x0) {
      local_120 = jaohI_local;
      local_130 = *(long *)(*(long *)jaohI_local + -0xb8);
      local_128 = jaohI_local + local_130;
      *(undefined8 *)(lVar13 + -8) = 0x9da5d3;
      pMVar12 = GetMADPDI(pPVar4);
      pcVar2 = *(code **)((long)*pMVar12 + 0x50);
      *(undefined8 *)(lVar13 + -8) = 0x9da5dc;
      uVar9 = (*pcVar2)();
      lVar3 = local_128;
      pcVar2 = *(code **)(*(long *)(local_120 + local_130) + 0x28);
      *(undefined8 *)(lVar13 + -8) = 0x9da5fb;
      (*pcVar2)(lVar3,uVar9);
    }
    else {
      pcVar2 = *(code **)(*(long *)jaohI_local + 0xa8);
      *(undefined8 *)(lVar13 + -8) = 0x9da60e;
      (*pcVar2)(LVar6,pJVar5);
    }
  }
  else {
    this_01 = &local_b0[0]->_m_params;
    *(undefined8 *)(lVar13 + -8) = 0x9da412;
    bVar7 = PlanningUnitMADPDiscreteParameters::GetComputeJointBeliefs(this_01);
    LVar6 = p_jaohI_local;
    pPVar4 = local_b0[0];
    if (bVar7) {
      this_02 = &local_b0[0]->_m_jBeliefCache;
      *(undefined8 *)(lVar13 + -8) = 0x9da438;
      IVar8 = Globals::CastLIndexToIndex(LVar6);
      *(undefined8 *)(lVar13 + -8) = 0x9da448;
      ppJVar10 = std::
                 vector<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>
                 ::operator[](this_02,(ulong)IVar8);
      LVar6 = jaohI_local;
      pJVar1 = *ppJVar10;
      pcVar2 = *(code **)(*(long *)jaohI_local + 0xa8);
      *(undefined8 *)(lVar13 + -8) = 0x9da458;
      (*pcVar2)(LVar6,pJVar1);
      LVar6 = p_jaohI_local;
      pvVar15 = &local_b0[0]->_m_jaohProbs;
      *(undefined8 *)(lVar13 + -8) = 0x9da475;
      IVar8 = Globals::CastLIndexToIndex(LVar6);
      *(undefined8 *)(lVar13 + -8) = 0x9da485;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](pvVar15,(ulong)IVar8);
      i = p_jb_local;
      p_pr = *pvVar11;
      pvVar15 = &local_b0[0]->_m_jaohProbs;
      *(undefined8 *)(lVar13 + -8) = 0x9da4b1;
      IVar8 = Globals::CastLIndexToIndex((LIndex)i);
      *(undefined8 *)(lVar13 + -8) = 0x9da4c1;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](pvVar15,(ulong)IVar8);
      return p_pr / *pvVar11;
    }
    local_108 = jaohI_local;
    local_118 = *(long *)(*(long *)jaohI_local + -0xb8);
    local_110 = jaohI_local + local_118;
    *(undefined8 *)(lVar13 + -8) = 0x9da530;
    pMVar12 = GetMADPDI(pPVar4);
    pcVar2 = *(code **)((long)*pMVar12 + 0x50);
    *(undefined8 *)(lVar13 + -8) = 0x9da539;
    uVar9 = (*pcVar2)();
    lVar3 = local_110;
    pcVar2 = *(code **)(*(long *)(local_108 + local_118) + 0x28);
    *(undefined8 *)(lVar13 + -8) = 0x9da558;
    (*pcVar2)(lVar3,uVar9);
    *(undefined8 *)(lVar13 + -0x10) = 0;
    *(undefined8 *)(lVar13 + -8) = 0;
    *(undefined8 *)(lVar13 + -0x18) = 0x9da594;
    GetJAOHProbsRecursively
              (*(PlanningUnitMADPDiscrete **)(lVar13 + 0xa0),
               *(JointBeliefInterface **)(lVar13 + 0x98),*(Index **)(lVar13 + 0x90),
               *(Index **)(lVar13 + 0x88),*(Index *)(lVar13 + 0x84),*(Index *)(lVar13 + 0x80),
               *(LIndex *)(lVar13 + 0xb8),*(JointPolicyDiscrete **)(lVar13 + 0xc0));
  }
  pJVar5 = _t_p;
  *(JointBeliefInterface **)(lVar13 + -0x10) = p_jb_local;
  *(JointPolicyDiscrete **)(lVar13 + -8) = pJVar5;
  *(undefined8 *)(lVar13 + -0x18) = 0x9da64b;
  dVar14 = GetJAOHProbsRecursively
                     (*(PlanningUnitMADPDiscrete **)(lVar13 + 0xa0),
                      *(JointBeliefInterface **)(lVar13 + 0x98),*(Index **)(lVar13 + 0x90),
                      *(Index **)(lVar13 + 0x88),*(Index *)(lVar13 + 0x84),*(Index *)(lVar13 + 0x80)
                      ,*(LIndex *)(lVar13 + 0xb8),*(JointPolicyDiscrete **)(lVar13 + 0xc0));
  return dVar14;
}

Assistant:

double 
PlanningUnitMADPDiscrete::GetJAOHProbs(
    //output args:
    JointBeliefInterface* jb, 
    //input args:
    LIndex jaohI, // the jaohI for which we want to know the probs
    LIndex p_jaohI, //=0 the GIVEN predecessor
    const JointBeliefInterface* p_jb,// = NULL, // the corresponding GIVEN jb of p
    const JointPolicyDiscrete * jpol// = NULL // the policy followed in
    ) const
{
    if(p_jaohI == 0 && p_jb == NULL && jpol==NULL) //the cacheable case
        if(_m_params.GetComputeJointBeliefs() )
        {
            //return the cached results...
            //
            //we have to make a copy (can't do jb = ..., because that would 
            //not be reflected in the calling function)
            *jb = *_m_jBeliefCache[CastLIndexToIndex(jaohI)]; 
            return (_m_jaohProbs[CastLIndexToIndex(jaohI)]);
        }
    //we can't get the cached result, so we have to compute.

    Index t = GetTimeStepForJAOHI(jaohI);
    Index t_p = GetTimeStepForJAOHI(p_jaohI);
    
    Index jaIs[t];
    Index joIs[t];
    GetJointActionObservationHistoryArrays(jaohI, t, jaIs, joIs);      
#if DEBUG_PUD_JAOHPROBS
    vector<Index> jaIsv,joIsv;
    JointActionObservationHistoryTree* jaoht = 
        GetJointActionObservationHistoryTree(jaohI);
    jaoht->GetJointActionObservationHistory()->
        GetJointActionObservationHistoryVectors(jaIsv, joIsv);
    
    cout << "t " << t << " " << jaohI  
         << "\njaIsv:" << SoftPrintVector(jaIsv)
         << ", joIsv:" << SoftPrintVector(joIsv)
         << ", jaoht:" << jaoht->GetJointActionObservationHistory()->SoftPrint()
         << endl;

    for(Index i=0;i!=t;++i)
        cout << "jaIs["<<i<<"]=" << jaIs[i] << " ";
    cout << endl;
#endif
    Index p_jaIs[t_p];
    Index p_joIs[t_p];
    
    if(p_jaohI != 0)
    {
        //check that p_jaohI is indeed a predecessor of jaohI, this consists of
        //two checks 1) the (quick) stage check::
        if (t_p >= t)
            return (0.0);

        if(t_p == 0)
            throw E(" p_jaohI != 0 but t_p == 0 ");

        //and 2) the consistency check
        GetJointActionObservationHistoryArrays(p_jaohI, t_p, p_jaIs, p_joIs); 
        for(Index tI=0; tI < t_p; tI++)
        {
            if ( jaIs[tI] == p_jaIs[tI] && 
                 joIs[tI] == p_joIs[tI]    )  
                ; //consistent
            else
            {
                cerr << "GetJAOHProbs:: Warning pred. inconsistent with requested jaohI" << endl;
                return (0.0); // p_jaohI is inconsistent with jaohI.
            }
        }
    }
    //p_jaIs[ t_p ... (t-1) ] contains the joint actions `still to be taken'
    //to get from p_jaohI to jaohI.

    if(p_jaohI != 0 && p_jb == NULL)
    {
        // a predecessor is specified, but without accompanying joint belief.
        // In this case we assume that a pure (deterministic) joint policy
        // that is consistent with p_jaohI has been followed.
        if(_m_params.GetComputeJointBeliefs() )
        {
            //if joint beliefs are cache use them:
            *jb = *_m_jBeliefCache[CastLIndexToIndex(jaohI)]; 
            double pr = _m_jaohProbs[CastLIndexToIndex(jaohI)];
            double p_pr = _m_jaohProbs[CastLIndexToIndex(p_jaohI)];
            double pr_cond = pr / p_pr;
            return pr_cond;
        }
        else
        {
            // Here we compute the joint belief corresponding to p_jaohI for
            // such a pure joint policy. by performing the belief update
            // starting from the first time step
            jb->Set( *GetMADPDI()->GetISD() );
            //*jb = *GetNewJointBeliefFromISD();
            GetJAOHProbsRecursively(jb, p_jaIs, p_joIs, 0, t_p, 
                    Globals::INITIAL_JAOHI );        
            //GetJAOHProbsRecursively(jb, p_jaIs, p_joIs, t0, t_p, jaoh0 );
        }
    }
    else if ( p_jb == NULL ) // and p_jaohI == 0
        jb->Set( *GetMADPDI()->GetISD() );
        //*jb = *GetNewJointBeliefFromISD();
    else
        *jb = *p_jb; //copy by value, we don't want to alter p_jb!

    double p = GetJAOHProbsRecursively(jb, 
            jaIs, joIs, t_p, t,
            //jaohI, 
            p_jaohI, 
            jpol);

    return(p);
}